

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  int iVar1;
  ImDrawChannel *pIVar2;
  void *pvVar3;
  int iVar4;
  ImDrawChannel *__dest;
  long lVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  
  if ((this->_Current != 0) || (1 < this->_Count)) {
    __assert_fail("_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x5de,"void ImDrawListSplitter::Split(ImDrawList *, int)");
  }
  iVar1 = (this->_Channels).Size;
  iVar4 = iVar1;
  if (iVar1 < channels_count) {
    if ((this->_Channels).Capacity < channels_count) {
      __dest = (ImDrawChannel *)ImGui::MemAlloc((long)channels_count << 5);
      pIVar2 = (this->_Channels).Data;
      if (pIVar2 != (ImDrawChannel *)0x0) {
        memcpy(__dest,pIVar2,(long)(this->_Channels).Size << 5);
        ImGui::MemFree((this->_Channels).Data);
      }
      (this->_Channels).Data = __dest;
      (this->_Channels).Capacity = channels_count;
    }
    (this->_Channels).Size = channels_count;
    iVar4 = channels_count;
  }
  this->_Count = channels_count;
  if (0 < iVar4) {
    *(this->_Channels).Data = (ImDrawChannel)ZEXT1632(ZEXT816(0) << 0x40);
    if (1 < channels_count) {
      uVar8 = 1;
      lVar7 = 0x38;
      do {
        lVar5 = (long)(this->_Channels).Size;
        if ((long)uVar8 < (long)iVar1) {
          if (lVar5 <= (long)uVar8) goto LAB_0018955c;
          pIVar2 = (this->_Channels).Data;
          if (*(int *)((long)pIVar2 + lVar7 + -0x14) < 0) {
            pvVar6 = ImGui::MemAlloc(0);
            pvVar3 = *(void **)((long)pIVar2 + lVar7 + -0x10);
            if (pvVar3 != (void *)0x0) {
              memcpy(pvVar6,pvVar3,(long)*(int *)((long)pIVar2 + lVar7 + -0x18) * 0x38);
              ImGui::MemFree(*(void **)((long)pIVar2 + lVar7 + -0x10));
            }
            *(void **)((long)pIVar2 + lVar7 + -0x10) = pvVar6;
            *(undefined4 *)((long)pIVar2 + lVar7 + -0x14) = 0;
          }
          *(undefined4 *)((long)pIVar2 + lVar7 + -0x18) = 0;
          if ((long)(this->_Channels).Size <= (long)uVar8) goto LAB_0018955c;
          pIVar2 = (this->_Channels).Data;
          if (*(int *)((long)pIVar2 + lVar7 + -4) < 0) {
            pvVar6 = ImGui::MemAlloc(0);
            pvVar3 = *(void **)((long)&(pIVar2->_CmdBuffer).Size + lVar7);
            if (pvVar3 != (void *)0x0) {
              memcpy(pvVar6,pvVar3,(long)*(int *)((long)pIVar2 + lVar7 + -8) * 2);
              ImGui::MemFree(*(void **)((long)&(pIVar2->_CmdBuffer).Size + lVar7));
            }
            *(void **)((long)&(pIVar2->_CmdBuffer).Size + lVar7) = pvVar6;
            *(undefined4 *)((long)pIVar2 + lVar7 + -4) = 0;
          }
          *(undefined4 *)((long)pIVar2 + lVar7 + -8) = 0;
        }
        else {
          if (lVar5 <= (long)uVar8) goto LAB_0018955c;
          *(undefined1 (*) [32])((long)(this->_Channels).Data + lVar7 + -0x18) =
               ZEXT1632(ZEXT816(0) << 0x40);
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x20;
      } while ((uint)channels_count != uVar8);
    }
    return;
  }
LAB_0018955c:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                ,0x66a,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_UNUSED(draw_list);
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
    {
        _Channels.reserve(channels_count); // Avoid over reserving since this is likely to stay stable
        _Channels.resize(channels_count);
    }
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
    }
}